

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O3

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_90<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_90<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>_>
         *this)

{
  EVP_PKEY_CTX *ctx;
  CATCH2_INTERNAL_TEMPLATE_TEST_90<slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>_>
  obj;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_60;
  SmallVectorBase<(anonymous_namespace)::Constructable> local_38;
  
  ::(anonymous_namespace)::Constructable::numConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyConstructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numDestructorCalls = 0;
  ::(anonymous_namespace)::Constructable::numAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numMoveAssignmentCalls = 0;
  ::(anonymous_namespace)::Constructable::numCopyAssignmentCalls = 0;
  local_60.data_ = (pointer)local_60.firstElement;
  local_60.len = 0;
  ctx = (EVP_PKEY_CTX *)0x2;
  local_60.cap = 2;
  local_38.data_ = (pointer)local_38.firstElement;
  local_38.len = 0;
  local_38.cap = 2;
  (*(code *)this->m_testAsMethod)(local_60.firstElement + *(long *)&this->field_0x10 + -0x18);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(&local_38,ctx);
  slang::SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup(&local_60,ctx);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }